

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O0

void icu_63::double_conversion::FixupMultiply10
               (int estimated_power,bool is_even,int *decimal_point,Bignum *numerator,
               Bignum *denominator,Bignum *delta_minus,Bignum *delta_plus)

{
  int iVar1;
  bool bVar2;
  bool in_range;
  Bignum *delta_minus_local;
  Bignum *denominator_local;
  Bignum *numerator_local;
  int *decimal_point_local;
  bool is_even_local;
  int estimated_power_local;
  
  if (is_even) {
    iVar1 = Bignum::PlusCompare(numerator,delta_plus,denominator);
    bVar2 = -1 < iVar1;
  }
  else {
    iVar1 = Bignum::PlusCompare(numerator,delta_plus,denominator);
    bVar2 = 0 < iVar1;
  }
  if (bVar2) {
    *decimal_point = estimated_power + 1;
  }
  else {
    *decimal_point = estimated_power;
    Bignum::Times10(numerator);
    bVar2 = Bignum::Equal(delta_minus,delta_plus);
    if (bVar2) {
      Bignum::Times10(delta_minus);
      Bignum::AssignBignum(delta_plus,delta_minus);
    }
    else {
      Bignum::Times10(delta_minus);
      Bignum::Times10(delta_plus);
    }
  }
  return;
}

Assistant:

static void FixupMultiply10(int estimated_power, bool is_even,
                            int* decimal_point,
                            Bignum* numerator, Bignum* denominator,
                            Bignum* delta_minus, Bignum* delta_plus) {
  bool in_range;
  if (is_even) {
    // For IEEE doubles half-way cases (in decimal system numbers ending with 5)
    // are rounded to the closest floating-point number with even significand.
    in_range = Bignum::PlusCompare(*numerator, *delta_plus, *denominator) >= 0;
  } else {
    in_range = Bignum::PlusCompare(*numerator, *delta_plus, *denominator) > 0;
  }
  if (in_range) {
    // Since numerator + delta_plus >= denominator we already have
    // 1 <= numerator/denominator < 10. Simply update the estimated_power.
    *decimal_point = estimated_power + 1;
  } else {
    *decimal_point = estimated_power;
    numerator->Times10();
    if (Bignum::Equal(*delta_minus, *delta_plus)) {
      delta_minus->Times10();
      delta_plus->AssignBignum(*delta_minus);
    } else {
      delta_minus->Times10();
      delta_plus->Times10();
    }
  }
}